

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.h
# Opt level: O1

void __thiscall
OrderMoney::OrderMoney<std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
          (OrderMoney *this,string *currency,shared_ptr<const_Bank> *bank,
          shared_ptr<RealMoney> *money,shared_ptr<RealMoney> *money_1)

{
  undefined1 local_71;
  ExchangedMoney *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  shared_ptr<const_Money> local_60;
  ExchangedMoney *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  shared_ptr<const_Money> local_40;
  
  local_50 = (ExchangedMoney *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ExchangedMoney,std::allocator<ExchangedMoney>,std::shared_ptr<RealMoney>const&,std::shared_ptr<Bank_const>const&,std::__cxx11::string_const&>
            (&_Stack_48,&local_50,(allocator<ExchangedMoney> *)&local_60,money,bank,currency);
  local_40.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_50->super_Money;
  local_40.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_48._M_pi;
  local_50 = (ExchangedMoney *)0x0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = (ExchangedMoney *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ExchangedMoney,std::allocator<ExchangedMoney>,std::shared_ptr<RealMoney>const&,std::shared_ptr<Bank_const>const&,std::__cxx11::string_const&>
            (&_Stack_68,&local_70,(allocator<ExchangedMoney> *)&local_71,money_1,bank,currency);
  local_60.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_70->super_Money;
  local_60.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_68._M_pi;
  local_70 = (ExchangedMoney *)0x0;
  _Stack_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  OrderMoney(this,&local_40,&local_60);
  if (local_60.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_68._M_pi);
  }
  if (local_40.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_48._M_pi);
  }
  return;
}

Assistant:

OrderMoney(
		const std::string &currency,
		const std::shared_ptr<const Bank> &bank,
		const T & ... money
	) : OrderMoney(std::make_shared<ExchangedMoney>(money, bank, currency)...)
	{
	}